

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::BuiltinDeserializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>
     ::deserialize<InputStream>
               (unique_ptr<int,_std::default_delete<int>_> *opt,InputStream *istream)

{
  int *piVar1;
  uint8_t discriminator;
  char local_19;
  
  std::istream::read((char *)istream->stream,(long)&local_19);
  if (local_19 == '\0') {
    piVar1 = (opt->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (opt->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    if (piVar1 != (int *)0x0) {
      operator_delete(piVar1,4);
    }
  }
  else {
    BuiltinDeserializer<std::unique_ptr<int,std::default_delete<int>>,void>::
    make_nonempty<std::unique_ptr<int,std::default_delete<int>>>(opt);
    std::istream::read((char *)istream->stream,
                       (long)(opt->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                             super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }